

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_utils.hpp
# Opt level: O0

void __thiscall
ELFIO::address_translator::set_address_translation
          (address_translator *this,
          vector<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
          *addr_trans)

{
  iterator iVar1;
  iterator iVar2;
  vector<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_> *addr_trans_local;
  address_translator *this_local;
  
  std::vector<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>::operator=
            (&this->addr_translations,addr_trans);
  iVar1 = std::vector<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>::
          begin(&this->addr_translations);
  iVar2 = std::vector<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>::end
                    (&this->addr_translations);
  std::
  sort<__gnu_cxx::__normal_iterator<ELFIO::address_translation*,std::vector<ELFIO::address_translation,std::allocator<ELFIO::address_translation>>>,ELFIO::address_translator::set_address_translation(std::vector<ELFIO::address_translation,std::allocator<ELFIO::address_translation>>&)::_lambda(ELFIO::address_translation_const&,ELFIO::address_translation_const&)_1_>
            (iVar1._M_current,iVar2._M_current);
  return;
}

Assistant:

void set_address_translation( std::vector<address_translation>& addr_trans )
    {
        addr_translations = addr_trans;

        std::sort( addr_translations.begin(), addr_translations.end(),
                   []( const address_translation& a,
                       const address_translation& b ) -> bool {
                       return a.start < b.start;
                   } );
    }